

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::SubdivMeshNode> *mesh,ssize_t id)

{
  MaterialNode *pMVar1;
  SubdivMeshNode *pSVar2;
  int __oflag;
  int __oflag_00;
  pointer pvVar3;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  pointer pvVar4;
  allocator local_f1;
  Ref<embree::SceneGraph::MaterialNode> local_f0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,"SubdivisionMesh",&local_f1);
  open(this,(char *)local_48,(int)id);
  std::__cxx11::string::~string(local_48);
  pMVar1 = (mesh->ptr->material).ptr;
  local_f0.ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])(pMVar1);
  }
  store(this,&local_f0);
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[3])(pMVar1);
  }
  pvVar4 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pvVar3 - (long)pvVar4 != 0x20) {
    std::__cxx11::string::string(local_68,"animated_positions",&local_f1);
    open(this,(char *)local_68,__oflag);
    std::__cxx11::string::~string(local_68);
    pvVar4 = (mesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (mesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pvVar4 != pvVar3; pvVar4 = pvVar4 + 1) {
    store(this,"positions",pvVar4);
  }
  pSVar2 = mesh->ptr;
  if ((long)(pSVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pSVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    std::__cxx11::string::string(local_88,"animated_positions",&local_f1);
    close(this,(int)local_88);
    std::__cxx11::string::~string(local_88);
    pSVar2 = mesh->ptr;
    if ((long)(pSVar2->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pSVar2->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      std::__cxx11::string::string(local_a8,"animated_normals",&local_f1);
      open(this,(char *)local_a8,__oflag_00);
      std::__cxx11::string::~string(local_a8);
      pSVar2 = mesh->ptr;
    }
  }
  pvVar3 = (pSVar2->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (pSVar2->normals).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar3; pvVar4 = pvVar4 + 1) {
    store(this,"normals",pvVar4);
  }
  pSVar2 = mesh->ptr;
  if ((long)(pSVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pSVar2->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    std::__cxx11::string::string(local_c8,"animated_normals",&local_f1);
    close(this,(int)local_c8);
    std::__cxx11::string::~string(local_c8);
    pSVar2 = mesh->ptr;
  }
  store<embree::Vec2<float>>(this,"texcoords",&pSVar2->texcoords);
  store<unsigned_int>(this,"position_indices",&mesh->ptr->position_indices);
  store<unsigned_int>(this,"normal_indices",&mesh->ptr->normal_indices);
  store<unsigned_int>(this,"texcoord_indices",&mesh->ptr->texcoord_indices);
  store<unsigned_int>(this,"faces",&mesh->ptr->verticesPerFace);
  store<unsigned_int>(this,"holes",&mesh->ptr->holes);
  store<embree::Vec2<int>>(this,"edge_creases",&mesh->ptr->edge_creases);
  store<float>(this,"edge_crease_weights",&mesh->ptr->edge_crease_weights);
  store<unsigned_int>(this,"vertex_creases",&mesh->ptr->vertex_creases);
  store<float>(this,"vertex_crease_weights",&mesh->ptr->vertex_crease_weights);
  std::__cxx11::string::string(local_e8,"SubdivisionMesh",&local_f1);
  close(this,(int)local_e8);
  std::__cxx11::string::~string(local_e8);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::SubdivMeshNode> mesh, ssize_t id)
  {
    open("SubdivisionMesh",id);
    store(mesh->material);
    
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");

    if (mesh->numTimeSteps() != 1) open("animated_normals");
    for (const auto& p : mesh->normals) store("normals",p);
    if (mesh->numTimeSteps() != 1) close("animated_normals");

    store("texcoords",mesh->texcoords);
    store("position_indices",mesh->position_indices);
    store("normal_indices",mesh->normal_indices);
    store("texcoord_indices",mesh->texcoord_indices);
    store("faces",mesh->verticesPerFace);
    store("holes",mesh->holes);
    store("edge_creases",mesh->edge_creases);
    store("edge_crease_weights",mesh->edge_crease_weights);
    store("vertex_creases",mesh->vertex_creases);
    store("vertex_crease_weights",mesh->vertex_crease_weights);
    close("SubdivisionMesh");
  }